

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O1

vector<unsigned_int,_true> * __thiscall
duckdb::ReservoirSample::GetRandomizedVector
          (vector<unsigned_int,_true> *__return_storage_ptr__,ReservoirSample *this,uint32_t range,
          uint32_t size)

{
  value_type vVar1;
  value_type vVar2;
  iterator __position;
  uint32_t uVar3;
  pointer this_00;
  reference pvVar4;
  ulong __n;
  size_type __n_00;
  uint local_40;
  uint32_t local_3c;
  ulong local_38;
  
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             (ulong)range);
  local_40 = 0;
  if (range != 0) {
    do {
      __position._M_current =
           (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                   __position,&local_40);
      }
      else {
        *__position._M_current = local_40;
        (__return_storage_ptr__->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_40 = local_40 + 1;
    } while (local_40 < range);
  }
  if (size != 0) {
    local_38 = (ulong)size;
    __n_00 = 0;
    local_3c = range;
    do {
      this_00 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                ::operator->(&(this->super_BlockingSample).base_reservoir_sample);
      uVar3 = RandomEngine::NextRandomInteger32((RandomEngine *)this_00,(uint32_t)__n_00,range);
      __n = (ulong)uVar3;
      if (__n_00 != __n) {
        pvVar4 = vector<unsigned_int,_true>::operator[](__return_storage_ptr__,__n);
        vVar1 = *pvVar4;
        pvVar4 = vector<unsigned_int,_true>::operator[](__return_storage_ptr__,__n_00);
        vVar2 = *pvVar4;
        pvVar4 = vector<unsigned_int,_true>::operator[](__return_storage_ptr__,__n);
        *pvVar4 = vVar2;
        pvVar4 = vector<unsigned_int,_true>::operator[](__return_storage_ptr__,__n_00);
        *pvVar4 = vVar1;
        range = local_3c;
      }
      __n_00 = __n_00 + 1;
    } while (local_38 != __n_00);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<uint32_t> ReservoirSample::GetRandomizedVector(uint32_t range, uint32_t size) const {
	vector<uint32_t> ret;
	ret.reserve(range);
	for (uint32_t i = 0; i < range; i++) {
		ret.push_back(i);
	}
	for (uint32_t i = 0; i < size; i++) {
		uint32_t random_shuffle = base_reservoir_sample->random.NextRandomInteger32(i, range);
		if (random_shuffle == i) {
			// leave the value where it is
			continue;
		}
		uint32_t tmp = ret[random_shuffle];
		// basically replacing the tuple that was at index actual_sample_indexes[random_shuffle]
		ret[random_shuffle] = ret[i];
		ret[i] = tmp;
	}
	return ret;
}